

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::SetIntegrationRule
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,int ord)

{
  TPZManVector<int,_3> *in_RDI;
  TPZManVector<int,_3> order;
  int in_stack_ffffffffffffffb4;
  TPZVec<int> *in_stack_ffffffffffffffb8;
  TPZIntTetra3D *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  TPZManVector<int,_3> *in_stack_ffffffffffffffd0;
  
  TPZManVector<int,_3>::TPZManVector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0);
  TPZIntTetra3D::SetOrder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  TPZManVector<int,_3>::~TPZManVector(in_RDI);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetIntegrationRule(int ord) {
	TPZManVector<int,3> order(TSHAPE::Dimension,ord);
	this->fIntRule.SetOrder(order);
}